

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O1

string * GetIPChannel_abi_cxx11_(string *__return_storage_ptr__,Node *IOChannel,int InputFlag)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  string local_40;
  
  if (IOChannel == (Node *)0x0) {
    bVar8 = true;
  }
  else {
    Node::NoParen_abi_cxx11_(&local_40,IOChannel);
    iVar2 = std::__cxx11::string::compare((char *)&local_40);
    bVar8 = iVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar8) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (InputFlag == 0) {
      pcVar7 = "std::cout";
      pcVar6 = "";
    }
    else {
      pcVar7 = "std::cin";
      pcVar6 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  }
  else {
    Node::Expression_abi_cxx11_(&local_60,IOChannel);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x12e253);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetIPChannel(
	Node *IOChannel,	/**< IOChannel. May be zero */
	int InputFlag		/**< INPUT/PRINT flag */
)
{
	//
	// Use default if no channel specified, else use
	// whatever is given
	//
	if ((IOChannel == 0) || (IOChannel->NoParen() == "0"))
	{
		if (InputFlag == 0)
		{
			return "std::cout";
		}
		else
		{
			return "std::cin";
		}
	}
	else
	{
		return "BasicChannel[" + IOChannel->Expression() + "]";
	}

}